

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O2

bool CB_ADF::test_adf_sequence(multi_ex *ec_seq)

{
  float fVar1;
  pointer ppeVar2;
  example *peVar3;
  wclass *pwVar4;
  vw_exception *pvVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  string local_1e0;
  string local_1c0;
  stringstream __msg;
  ostream local_190;
  
  ppeVar2 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar6 = 0;
  lVar7 = 0;
  while( true ) {
    if ((long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)ppeVar2 >> 3 == lVar7) {
      if (uVar6 < 2) {
        return uVar6 == 0;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<(&local_190,"cb_adf: badly formatted example, only one line can have a cost");
      pvVar5 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar5,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cb_adf.cc"
                 ,0xe7,&local_1e0);
      __cxa_throw(pvVar5,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    peVar3 = ppeVar2[lVar7];
    pwVar4 = (peVar3->l).cs.costs._begin;
    uVar8 = (long)(peVar3->l).cs.costs._end - (long)pwVar4;
    if (0x10 < uVar8) break;
    if ((uVar8 == 0x10) && ((fVar1 = pwVar4->x, fVar1 != 3.4028235e+38 || (NAN(fVar1))))) {
      uVar6 = uVar6 + 1;
    }
    lVar7 = lVar7 + 1;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
  std::operator<<(&local_190,"cb_adf: badly formatted example, only one cost can be known.");
  pvVar5 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (pvVar5,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cb_adf.cc"
             ,0xdd,&local_1c0);
  __cxa_throw(pvVar5,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

bool test_adf_sequence(multi_ex& ec_seq)
{
  uint32_t count = 0;
  for (size_t k = 0; k < ec_seq.size(); k++)
  {
    example* ec = ec_seq[k];
    if (ec->l.cb.costs.size() > 1)
      THROW("cb_adf: badly formatted example, only one cost can be known.");

    if (ec->l.cb.costs.size() == 1 && ec->l.cb.costs[0].cost != FLT_MAX)
      count += 1;
  }
  if (count == 0)
    return true;
  else if (count == 1)
    return false;
  else
    THROW("cb_adf: badly formatted example, only one line can have a cost");
}